

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O1

string * std::format<std::__cxx11::string>
                   (string *__return_storage_ptr__,string_view fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts)

{
  char *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  stringstream ss;
  long alStack_3b8 [2];
  char *local_3a8;
  long alStack_3a0 [62];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar5 = fmt._M_str;
  sVar8 = fmt._M_len;
  uVar9 = 0;
  memset(alStack_3b8 + 1,0,0x200);
  pcVar1 = pcVar5 + sVar8;
  pcVar4 = pcVar5;
  if (sVar8 != 0) {
    uVar9 = 0;
    pcVar3 = pcVar5;
    pcVar6 = pcVar5;
    pcVar7 = pcVar5;
    do {
      pcVar4 = pcVar7;
      if ((*pcVar7 != '}') && (pcVar4 = pcVar3, *pcVar7 == '{')) {
        if (pcVar3 == pcVar5) {
          alStack_3b8[uVar9 * 2 + 1] = (long)pcVar6 - (long)pcVar3;
          (&local_3a8)[uVar9 * 2] = pcVar3;
          uVar9 = uVar9 + 1;
        }
        else if (uVar9 < 0x20 && pcVar7 != pcVar3) {
          alStack_3b8[uVar9 * 2 + 1] = (long)(pcVar6 + ~(ulong)pcVar3);
          (&local_3a8)[uVar9 * 2] = pcVar3 + 1;
          uVar9 = uVar9 + 1;
        }
      }
      pcVar7 = pcVar7 + 1;
      pcVar6 = pcVar6 + 1;
      sVar8 = sVar8 - 1;
      pcVar3 = pcVar4;
    } while (sVar8 != 0);
  }
  pcVar4 = pcVar4 + 1;
  if (pcVar4 != pcVar1) {
    alStack_3b8[uVar9 * 2 + 1] = (long)pcVar1 - (long)pcVar4;
    (&local_3a8)[uVar9 * 2] = pcVar4;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_3a8,alStack_3b8[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  for (lVar10 = 0x18; lVar10 != 0x208; lVar10 = lVar10 + 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,*(char **)((long)alStack_3b8 + lVar10 + 8U),
               *(long *)((long)alStack_3b8 + lVar10));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}